

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O0

void __thiscall w3Module::read_functions(w3Module *this,uint8_t **cursor)

{
  uint32_t uVar1;
  size_type sVar2;
  w3Function *pwVar3;
  reference pvVar4;
  w3Function *a;
  size_t i;
  size_t size;
  size_t old;
  uint8_t **cursor_local;
  w3Module *this_local;
  
  printf("reading section 3 offset:%lX\n",(long)*cursor - (long)this->base);
  sVar2 = std::vector<w3Function,_std::allocator<w3Function>_>::size(&this->functions);
  if (sVar2 != this->import_function_count) {
    AssertFailed("old == import_function_count");
  }
  uVar1 = read_varuint32(this,cursor);
  pwVar3 = (w3Function *)(ulong)uVar1;
  std::vector<w3Function,_std::allocator<w3Function>_>::resize
            (&this->functions,(long)&pwVar3->function_index + sVar2);
  for (a = (w3Function *)0x0; a < pwVar3; a = (w3Function *)((long)&a->function_index + 1)) {
    printf("read_function %lX:%lX\n",a,pwVar3);
    pvVar4 = std::vector<w3Function,_std::allocator<w3Function>_>::operator[]
                       (&this->functions,(long)&a->function_index + sVar2);
    uVar1 = read_varuint32(this,cursor);
    pvVar4->function_type_index = (ulong)uVar1;
    pvVar4->function_index = (long)&a->function_index + sVar2;
    pvVar4->import = false;
  }
  printf("read section 3\n");
  return;
}

Assistant:

void w3Module::read_functions (uint8_t** cursor)
{
    printf ("reading section 3 offset:%" FORMAT_SIZE "X\n", (long_t)(*cursor - this->base));
    const size_t old = functions.size ();
    Assert (old == import_function_count);
    const size_t size = read_varuint32 (cursor);
    functions.resize (old + size);
    for (size_t i = 0; i < size; ++i)
    {
        printf ("read_function %" FORMAT_SIZE "X:%" FORMAT_SIZE "X\n", i, size);
        w3Function& a = functions [old + i];
        a.function_type_index = read_varuint32 (cursor);
        a.function_index = i + old; // TODO probably not needed
        a.import = false; // TODO probably not needed
    }
    printf ("read section 3\n");
}